

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_QuickSortCostData(int *pCosts,int nSize,int fDecrease,word *pData,int *pResult)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < nSize) {
    uVar3 = (ulong)(uint)nSize;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pData[uVar2] = (long)pCosts[uVar2] | uVar1;
    uVar1 = uVar1 + 0x100000000;
  }
  Abc_QuickSort3(pData,nSize,fDecrease);
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    pResult[uVar1] = *(int *)((long)pData + uVar1 * 8 + 4);
  }
  return;
}

Assistant:

void Abc_QuickSortCostData( int * pCosts, int nSize, int fDecrease, word * pData, int * pResult )
{
    int i;
    for ( i = 0; i < nSize; i++ )
        pData[i] = ((word)i << 32) | pCosts[i];
    Abc_QuickSort3( pData, nSize, fDecrease );
    for ( i = 0; i < nSize; i++ )
        pResult[i] = (int)(pData[i] >> 32);
}